

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_util.c
# Opt level: O0

lzma_ret lzma_block_compressed_size(lzma_block *block,lzma_vli unpadded_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  lzma_vli lVar4;
  lzma_vli compressed_size;
  uint32_t container_size;
  lzma_vli unpadded_size_local;
  lzma_block *block_local;
  
  lVar4 = lzma_block_unpadded_size(block);
  if (lVar4 == 0) {
    block_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    uVar1 = block->header_size;
    uVar2 = lzma_check_size(block->check);
    uVar3 = uVar1 + uVar2;
    if (uVar3 < unpadded_size) {
      lVar4 = unpadded_size - uVar3;
      if ((block->compressed_size == 0xffffffffffffffff) || (block->compressed_size == lVar4)) {
        block->compressed_size = lVar4;
        block_local._4_4_ = LZMA_OK;
      }
      else {
        block_local._4_4_ = LZMA_DATA_ERROR;
      }
    }
    else {
      block_local._4_4_ = LZMA_DATA_ERROR;
    }
  }
  return block_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_compressed_size(lzma_block *block, lzma_vli unpadded_size)
{
	uint32_t container_size;
	lzma_vli compressed_size;

	// Validate everything but Uncompressed Size and filters.
	if (lzma_block_unpadded_size(block) == 0)
		return LZMA_PROG_ERROR;

	container_size = block->header_size
			+ lzma_check_size(block->check);

	// Validate that Compressed Size will be greater than zero.
	if (unpadded_size <= container_size)
		return LZMA_DATA_ERROR;

	// Calculate what Compressed Size is supposed to be.
	// If Compressed Size was present in Block Header,
	// compare that the new value matches it.
	compressed_size = unpadded_size - container_size;
	if (block->compressed_size != LZMA_VLI_UNKNOWN
			&& block->compressed_size != compressed_size)
		return LZMA_DATA_ERROR;

	block->compressed_size = compressed_size;

	return LZMA_OK;
}